

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*>::
emplaceRealloc<slang::syntax::ConfigInstanceIdentifierSyntax*>
          (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *this,pointer pos,
          ConfigInstanceIdentifierSyntax **args)

{
  pointer ppCVar1;
  ulong uVar2;
  SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *__src;
  void *__dest;
  long lVar3;
  ulong uVar4;
  
  if (*(long *)(this + 8) != 0xfffffffffffffff) {
    uVar4 = *(long *)(this + 8) + 1;
    uVar2 = *(ulong *)(this + 0x10);
    if (uVar4 < uVar2 * 2) {
      uVar4 = uVar2 * 2;
    }
    if (0xfffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0xfffffffffffffff;
    }
    lVar3 = *(long *)this;
    __dest = operator_new(uVar4 * 8);
    ppCVar1 = (pointer)((long)__dest + ((long)pos - lVar3));
    *(ConfigInstanceIdentifierSyntax **)((long)__dest + ((long)pos - lVar3)) = *args;
    __src = *(SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> **)this;
    lVar3 = *(long *)(this + 8);
    if (__src + (lVar3 * 8 - (long)pos) ==
        (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *)0x0) {
      if (lVar3 != 0) {
        memmove(__dest,__src,lVar3 * 8);
      }
    }
    else {
      if (__src != (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *)pos) {
        memmove(__dest,__src,(long)pos - (long)__src);
      }
      memcpy(ppCVar1 + 1,pos,(size_t)(__src + (lVar3 * 8 - (long)pos)));
    }
    if (__src != this + 0x18) {
      operator_delete(__src);
      lVar3 = *(long *)(this + 8);
    }
    *(long *)(this + 8) = lVar3 + 1;
    *(ulong *)(this + 0x10) = uVar4;
    *(void **)this = __dest;
    return ppCVar1;
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}